

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerCoerseRegex(Lowerer *this,Instr *instr)

{
  bool bVar1;
  LabelInstr *labelTarget;
  LabelInstr *target;
  Opnd *pOVar2;
  Lowerer *baseOpnd;
  IndirOpnd *compareSrc1;
  AddrOpnd *opndArg;
  Lowerer *this_00;
  LowererMD *this_01;
  
  labelTarget = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  pOVar2 = IR::Instr::UnlinkSrc1(instr);
  baseOpnd = (Lowerer *)IR::Opnd::AsRegOpnd(pOVar2);
  bVar1 = IR::Opnd::IsNotTaggedValue((Opnd *)baseOpnd);
  if (!bVar1) {
    LowererMD::GenerateObjectTest(&this->m_lowererMD,(Opnd *)baseOpnd,instr,labelTarget,false);
  }
  pOVar2 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
  this_00 = baseOpnd;
  compareSrc1 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,0,TyUint64,instr->m_func,false);
  InsertCompareBranch(this_00,&compareSrc1->super_Opnd,pOVar2,BrNeq_A,labelTarget,instr,false);
  InsertMove(instr->m_dst,(Opnd *)baseOpnd,instr,true);
  InsertBranch(Br,target,instr);
  IR::Instr::InsertBefore(instr,&labelTarget->super_Instr);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  LoadScriptContext(this,instr);
  this_01 = &this->m_lowererMD;
  opndArg = IR::AddrOpnd::NewNull(instr->m_func);
  LowererMD::LoadHelperArgument(this_01,instr,&opndArg->super_Opnd);
  LowererMD::LoadHelperArgument(this_01,instr,(Opnd *)baseOpnd);
  LowererMD::ChangeToHelperCall
            (this_01,instr,HelperOp_CoerseRegex,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0
             ,false);
  return;
}

Assistant:

void
Lowerer::LowerCoerseRegex(IR::Instr* instr)
{
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr * doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::RegOpnd * src1Opnd = instr->UnlinkSrc1()->AsRegOpnd();
    if (!src1Opnd->IsNotTaggedValue())
    {
        this->m_lowererMD.GenerateObjectTest(src1Opnd, instr, helperLabel);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    InsertCompareBranch(IR::IndirOpnd::New(src1Opnd, 0, TyMachPtr, instr->m_func),
        vtableOpnd, Js::OpCode::BrNeq_A, helperLabel, instr);

    InsertMove(instr->GetDst(), src1Opnd, instr);
    InsertBranch(Js::OpCode::Br, doneLabel, instr);
    instr->InsertBefore(helperLabel);
    instr->InsertAfter(doneLabel);

    this->LoadScriptContext(instr);
    this->m_lowererMD.LoadHelperArgument(instr, IR::AddrOpnd::NewNull(instr->m_func));   // option
    this->m_lowererMD.LoadHelperArgument(instr, src1Opnd); // regex
    this->m_lowererMD.ChangeToHelperCall(instr, IR::HelperOp_CoerseRegex);
}